

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlIO(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined8 uVar24;
  xmlParserCtxtPtr pxVar25;
  long lVar26;
  xmlBufferPtr pxVar27;
  FILE *pFVar28;
  size_t sVar29;
  xmlParserInputBufferPtr pxVar30;
  int test_ret_1;
  int n_path;
  uint uVar31;
  ulong in_RSI;
  ulong uVar32;
  ulong uVar33;
  undefined *puVar34;
  int test_ret_2;
  int iVar35;
  undefined4 *puVar36;
  undefined8 *puVar37;
  bool bVar38;
  int test_ret;
  int iVar39;
  uint uVar40;
  uint uVar41;
  uint *puVar42;
  int test_ret_3;
  char *pcVar43;
  int n_len;
  uint uVar44;
  undefined4 uVar45;
  int test_ret_16;
  int test_ret_22;
  int test_ret_14;
  int test_ret_13;
  int test_ret_17;
  int test_ret_21;
  int test_ret_20;
  int local_58;
  int local_4c;
  int local_48;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlIO : 40 of 50 functions ...");
  }
  iVar2 = xmlMemBlocks();
  uVar24 = xmlAllocOutputBuffer(0);
  xmlOutputBufferClose(uVar24);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlAllocOutputBuffer");
    in_RSI = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar36 = &DAT_00155228;
  uVar31 = 0;
  iVar39 = 0;
  do {
    iVar4 = xmlMemBlocks();
    uVar45 = 0xffffffff;
    if (uVar31 < 3) {
      uVar45 = *puVar36;
    }
    uVar24 = xmlAllocParserInputBuffer(uVar45);
    xmlFreeParserInputBuffer(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlAllocParserInputBuffer",(ulong)(uint)(iVar5 - iVar4));
      iVar39 = iVar39 + 1;
      in_RSI = (ulong)uVar31;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar36 = puVar36 + 1;
  } while (uVar31 != 4);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d58;
  uVar31 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar31 < 3) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlCheckFilename(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckFilename",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      in_RSI = (ulong)uVar31;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar6 = 0;
  do {
    iVar8 = (int)in_RSI;
    iVar7 = xmlMemBlocks();
    pxVar25 = gen_xmlParserCtxtPtr(iVar6,iVar8);
    in_RSI = 0;
    uVar24 = xmlCheckHTTPInput(pxVar25);
    xmlFreeInputStream(uVar24);
    call_tests = call_tests + 1;
    if (pxVar25 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar25);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckHTTPInput",(ulong)(uint)(iVar8 - iVar7));
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlCleanupInputCallbacks();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCleanupInputCallbacks");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlCleanupOutputCallbacks();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCleanupOutputCallbacks");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar35 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar10 = xmlMemBlocks();
    xmlFileClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileClose",(ulong)(uint)(iVar11 - iVar10));
      iVar35 = iVar35 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlFileMatch(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileMatch",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlFileOpen(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFileOpen",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar31 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    puVar36 = &DAT_0016343c;
    iVar13 = 0;
    do {
      iVar14 = xmlMemBlocks();
      xmlFileRead(0,0,*puVar36);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlFileRead",(ulong)(uint)(iVar15 - iVar14));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar13 = iVar13 + 1;
      puVar36 = puVar36 + 1;
    } while (iVar13 != 4);
    uVar31 = 1;
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  iVar13 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar14 = xmlMemBlocks();
    xmlIOFTPClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPClose",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlIOFTPMatch(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPMatch",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar15 = 0;
  do {
    iVar16 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlIOFTPOpen(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOFTPOpen",(ulong)(uint)(iVar17 - iVar16));
      iVar15 = iVar15 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar31 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    puVar36 = &DAT_0016343c;
    iVar17 = 0;
    do {
      iVar18 = xmlMemBlocks();
      xmlIOFTPRead(0,0,*puVar36);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIOFTPRead",(ulong)(uint)(iVar19 - iVar18));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar17 = iVar17 + 1;
      puVar36 = puVar36 + 1;
    } while (iVar17 != 4);
    uVar31 = 1;
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  iVar17 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar18 = xmlMemBlocks();
    xmlIOHTTPClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPClose",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlIOHTTPMatch(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPMatch",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d90;
  uVar31 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    if (uVar31 < 7) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    xmlIOHTTPOpen(uVar24);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIOHTTPOpen",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar31 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    puVar36 = &DAT_0016343c;
    uVar33 = 0;
    do {
      iVar20 = xmlMemBlocks();
      uVar32 = 0;
      xmlIOHTTPRead(0,0,*puVar36);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      iVar22 = (int)uVar33;
      if (iVar20 != iVar21) {
        iVar21 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIOHTTPRead",(ulong)(uint)(iVar21 - iVar20));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        uVar32 = uVar33;
      }
      uVar44 = iVar22 + 1;
      uVar33 = (ulong)uVar44;
      puVar36 = puVar36 + 1;
    } while (uVar44 != 4);
    uVar31 = 1;
    bVar1 = false;
  } while (bVar38);
  iVar20 = 0;
  function_tests = function_tests + 1;
  uVar31 = 0;
  do {
    uVar33 = 0;
    do {
      uVar44 = 0;
      do {
        iVar22 = (int)uVar32;
        iVar21 = xmlMemBlocks();
        if (uVar31 < 7) {
          uVar24 = (&DAT_00165d90)[uVar31];
        }
        else {
          uVar24 = 0;
        }
        if ((uint)uVar33 < 3) {
          uVar32 = (&DAT_00165d58)[uVar33];
        }
        else {
          uVar32 = 0;
        }
        pxVar25 = gen_xmlParserCtxtPtr(uVar44,iVar22);
        uVar24 = xmlNoNetExternalEntityLoader(uVar24,uVar32,pxVar25);
        xmlFreeInputStream(uVar24);
        call_tests = call_tests + 1;
        if (pxVar25 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar25);
        }
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNoNetExternalEntityLoader",
                 (ulong)(uint)(iVar22 - iVar21));
          iVar20 = iVar20 + 1;
          printf(" %d",(ulong)uVar31);
          printf(" %d",uVar33);
          uVar32 = (ulong)uVar44;
          printf(" %d");
          putchar(10);
        }
        uVar44 = uVar44 + 1;
      } while (uVar44 != 3);
      uVar44 = (uint)uVar33 + 1;
      uVar33 = (ulong)uVar44;
    } while (uVar44 != 4);
    uVar31 = uVar31 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00165d70;
  uVar31 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    if (uVar31 < 4) {
      uVar24 = *puVar37;
    }
    else {
      uVar24 = 0;
    }
    lVar26 = xmlNormalizeWindowsPath(uVar24);
    if (lVar26 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNormalizeWindowsPath",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      uVar32 = (ulong)uVar31;
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar31 != 5);
  iVar2 = iVar18 + iVar19 +
          iVar14 + iVar15 +
          iVar10 + iVar11 +
          iVar39 + (uint)(iVar2 != iVar3) + iVar4 + iVar5 + (uint)(iVar6 != iVar7) +
          (uint)(iVar8 != iVar9) + iVar35 + iVar12 + iVar13 + iVar16 + iVar17 + local_40;
  function_tests = function_tests + 1;
  local_58 = 0;
  iVar3 = 0;
  do {
    iVar4 = (int)uVar32;
    iVar39 = xmlMemBlocks();
    pxVar27 = gen_xmlBufferPtr(iVar3,iVar4);
    uVar32 = 0;
    uVar24 = xmlOutputBufferCreateBuffer(pxVar27);
    xmlOutputBufferClose(uVar24);
    call_tests = call_tests + 1;
    if (pxVar27 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar27);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar39 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateBuffer",(ulong)(uint)(iVar4 - iVar39))
      ;
      local_58 = local_58 + 1;
      printf(" %d");
      uVar32 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  puVar36 = &DAT_0016343c;
  local_3c = 0;
  uVar31 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar45 = 0xffffffff;
    if (uVar31 < 4) {
      uVar45 = *puVar36;
    }
    uVar24 = xmlOutputBufferCreateFd(uVar45,0);
    xmlOutputBufferClose(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar39 = xmlMemBlocks();
    if (iVar3 != iVar39) {
      iVar39 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateFd",(ulong)(uint)(iVar39 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar31 = uVar31 + 1;
    puVar36 = puVar36 + 1;
  } while (uVar31 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar39 = xmlMemBlocks();
    if (bVar38) {
      pFVar28 = fopen64("test.out","a+");
    }
    else {
      pFVar28 = (FILE *)0x0;
    }
    uVar24 = xmlOutputBufferCreateFile(pFVar28,0);
    xmlOutputBufferClose(uVar24);
    call_tests = call_tests + 1;
    if (pFVar28 != (FILE *)0x0) {
      fclose(pFVar28);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar39 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferCreateFile",(ulong)(uint)(iVar4 - iVar39));
      iVar3 = iVar3 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  iVar39 = 0;
  uVar31 = 0;
  do {
    iVar4 = 0;
    puVar36 = &DAT_0016343c;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar31 < 5) {
        puVar34 = (&PTR_anon_var_dwarf_658_00165d30)[uVar31];
      }
      else {
        puVar34 = (undefined *)0x0;
      }
      xmlOutputBufferCreateFilename(puVar34,0,*puVar36);
      xmlOutputBufferClose();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlOutputBufferCreateFilename",
               (ulong)(uint)(iVar6 - iVar5));
        iVar39 = iVar39 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar4 = iVar4 + 1;
      puVar36 = puVar36 + 1;
    } while (iVar4 != 4);
    uVar31 = uVar31 + 1;
  } while (uVar31 != 6);
  function_tests = function_tests + 1;
  local_34 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar4 = xmlMemBlocks();
    if (bVar38) {
      lVar26 = xmlOutputBufferCreateFilename("test.out",0,0);
    }
    else {
      lVar26 = 0;
    }
    xmlOutputBufferFlush(lVar26);
    call_tests = call_tests + 1;
    if (lVar26 != 0) {
      xmlOutputBufferClose(lVar26);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferFlush",(ulong)(uint)(iVar5 - iVar4));
      local_34 = local_34 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  local_38 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar4 = xmlMemBlocks();
    if (bVar38) {
      lVar26 = xmlOutputBufferCreateFilename("test.out",0,0);
    }
    else {
      lVar26 = 0;
    }
    xmlOutputBufferGetContent(lVar26);
    call_tests = call_tests + 1;
    if (lVar26 != 0) {
      xmlOutputBufferClose(lVar26);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlOutputBufferGetContent",(ulong)(uint)(iVar5 - iVar4));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  local_4c = 0;
  local_40 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    uVar31 = 0;
    do {
      puVar37 = &DAT_00165d58;
      uVar44 = 0;
      do {
        iVar4 = xmlMemBlocks();
        if (bVar38) {
          lVar26 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          lVar26 = 0;
        }
        iVar5 = -1;
        if (uVar31 < 4) {
          iVar5 = (&DAT_0016343c)[uVar31];
        }
        if (uVar44 < 3) {
          pcVar43 = (char *)*puVar37;
          sVar29 = strlen(pcVar43);
          if (iVar5 <= (int)sVar29 + 1) goto LAB_0013d49b;
        }
        else {
          pcVar43 = (char *)0x0;
LAB_0013d49b:
          xmlOutputBufferWrite(lVar26,iVar5,pcVar43);
          call_tests = call_tests + 1;
          if (lVar26 != 0) {
            xmlOutputBufferClose(lVar26);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlOutputBufferWrite",(ulong)(uint)(iVar5 - iVar4));
            local_4c = local_4c + 1;
            printf(" %d",(ulong)local_40);
            printf(" %d",(ulong)uVar31);
            printf(" %d");
            putchar(10);
          }
        }
        uVar44 = uVar44 + 1;
        puVar37 = puVar37 + 1;
      } while (uVar44 != 4);
      uVar31 = uVar31 + 1;
    } while (uVar31 != 4);
    local_40 = 1;
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar31 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    iVar5 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (bVar38) {
        lVar26 = xmlOutputBufferCreateFilename("test.out",0,0);
      }
      else {
        lVar26 = 0;
      }
      xmlOutputBufferWriteString(lVar26);
      call_tests = call_tests + 1;
      if (lVar26 != 0) {
        xmlOutputBufferClose(lVar26);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlOutputBufferWriteString",(ulong)(uint)(iVar7 - iVar6))
        ;
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d");
        putchar(10);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    uVar31 = 1;
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar31 = 0;
  do {
    uVar44 = 0;
    puVar36 = &DAT_00155228;
    do {
      iVar5 = xmlMemBlocks();
      uVar45 = 0xffffffff;
      if (uVar44 < 3) {
        uVar45 = *puVar36;
      }
      uVar24 = xmlParserInputBufferCreateFd(0xffffffff,uVar45);
      xmlFreeParserInputBuffer(uVar24);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFd",
               (ulong)(uint)(iVar6 - iVar5));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",(ulong)uVar44);
        putchar(10);
      }
      uVar44 = uVar44 + 1;
      puVar36 = puVar36 + 1;
    } while (uVar44 != 4);
    uVar31 = uVar31 + 1;
  } while (uVar31 != 4);
  iVar2 = local_3c + iVar3 + iVar2 + iVar20 + iVar21 + local_58 + iVar39 + local_34 + local_38 +
          local_4c;
  function_tests = function_tests + 1;
  local_4c = 0;
  uVar31 = 0;
  bVar1 = true;
  do {
    bVar38 = bVar1;
    puVar36 = &DAT_00155228;
    uVar33 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (bVar38) {
        pFVar28 = fopen64("test.out","a+");
      }
      else {
        pFVar28 = (FILE *)0x0;
      }
      uVar45 = 0xffffffff;
      if ((uint)uVar33 < 3) {
        uVar45 = *puVar36;
      }
      uVar24 = xmlParserInputBufferCreateFile(pFVar28,uVar45);
      xmlFreeParserInputBuffer(uVar24);
      call_tests = call_tests + 1;
      if (pFVar28 != (FILE *)0x0) {
        fclose(pFVar28);
      }
      xmlResetLastError();
      iVar39 = xmlMemBlocks();
      if (iVar3 != iVar39) {
        iVar39 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFile",
               (ulong)(uint)(iVar39 - iVar3));
        local_4c = local_4c + 1;
        printf(" %d",(ulong)uVar31);
        printf(" %d",uVar33);
        putchar(10);
      }
      uVar44 = (uint)uVar33 + 1;
      uVar33 = (ulong)uVar44;
      puVar36 = puVar36 + 1;
    } while (uVar44 != 4);
    uVar31 = 1;
    bVar1 = false;
  } while (bVar38);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar31 = 0;
  do {
    uVar44 = 0;
    puVar42 = &DAT_00155228;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar31 < 5) {
        puVar34 = (&PTR_anon_var_dwarf_658_00165d30)[uVar31];
      }
      else {
        puVar34 = (undefined *)0x0;
      }
      uVar33 = 0xffffffff;
      if (uVar44 < 3) {
        uVar33 = (ulong)*puVar42;
      }
      xmlParserInputBufferCreateFilename(puVar34);
      xmlFreeParserInputBuffer();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar39 = xmlMemBlocks();
      if (iVar3 != iVar39) {
        iVar39 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFilename",
               (ulong)(uint)(iVar39 - iVar3));
        local_38 = local_38 + 1;
        printf(" %d",(ulong)uVar31);
        uVar33 = (ulong)uVar44;
        printf(" %d");
        putchar(10);
      }
      uVar44 = uVar44 + 1;
      puVar42 = puVar42 + 1;
    } while (uVar44 != 4);
    uVar31 = uVar31 + 1;
  } while (uVar31 != 6);
  function_tests = function_tests + 1;
  local_40 = 0;
  iVar3 = 0;
  do {
    uVar31 = 0;
    do {
      uVar32 = 0;
      puVar36 = &DAT_00155228;
      do {
        iVar39 = xmlMemBlocks();
        if (iVar3 == 0) {
          pcVar43 = "foo";
LAB_0013d944:
          bVar1 = false;
        }
        else {
          if (iVar3 == 2) {
            pcVar43 = "test/ent2";
            goto LAB_0013d944;
          }
          if (iVar3 == 1) {
            bVar1 = false;
            pcVar43 = "<foo/>";
          }
          else {
            bVar1 = true;
            pcVar43 = (char *)0x0;
          }
        }
        uVar45 = 0xffffffff;
        uVar44 = 0xffffffff;
        if (uVar31 < 4) {
          uVar44 = (&DAT_0016343c)[uVar31];
        }
        uVar40 = (uint)uVar32;
        if (uVar40 < 3) {
          uVar45 = *puVar36;
        }
        if ((bVar1) || (sVar29 = strlen(pcVar43), (int)uVar44 <= (int)sVar29 + 1)) {
          uVar33 = (ulong)uVar44;
          uVar24 = xmlParserInputBufferCreateMem(pcVar43,uVar33,uVar45);
          xmlFreeParserInputBuffer(uVar24);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar39 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
                   (ulong)(uint)(iVar5 - iVar39));
            local_40 = local_40 + 1;
            printf(" %d",iVar3);
            printf(" %d",(ulong)uVar31);
            printf(" %d");
            putchar(10);
            uVar33 = uVar32;
          }
        }
        uVar40 = uVar40 + 1;
        uVar32 = (ulong)uVar40;
        puVar36 = puVar36 + 1;
      } while (uVar40 != 4);
      uVar31 = uVar31 + 1;
    } while (uVar31 != 4);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  iVar2 = iVar2 + iVar4 + local_48 + local_4c;
  function_tests = function_tests + 1;
  local_4c = 0;
  iVar3 = 0;
  do {
    uVar31 = 0;
    do {
      uVar32 = 0;
      puVar36 = &DAT_00155228;
      do {
        iVar39 = xmlMemBlocks();
        if (iVar3 == 0) {
          pcVar43 = "foo";
LAB_0013daaa:
          bVar1 = false;
        }
        else {
          if (iVar3 == 2) {
            pcVar43 = "test/ent2";
            goto LAB_0013daaa;
          }
          if (iVar3 == 1) {
            bVar1 = false;
            pcVar43 = "<foo/>";
          }
          else {
            bVar1 = true;
            pcVar43 = (char *)0x0;
          }
        }
        uVar45 = 0xffffffff;
        uVar44 = 0xffffffff;
        if (uVar31 < 4) {
          uVar44 = (&DAT_0016343c)[uVar31];
        }
        uVar40 = (uint)uVar32;
        if (uVar40 < 3) {
          uVar45 = *puVar36;
        }
        if ((bVar1) || (sVar29 = strlen(pcVar43), (int)uVar44 <= (int)sVar29 + 1)) {
          uVar33 = (ulong)uVar44;
          uVar24 = xmlParserInputBufferCreateStatic(pcVar43,uVar33,uVar45);
          xmlFreeParserInputBuffer(uVar24);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar39 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferCreateStatic",
                   (ulong)(uint)(iVar4 - iVar39));
            local_4c = local_4c + 1;
            printf(" %d",iVar3);
            printf(" %d",(ulong)uVar31);
            printf(" %d");
            putchar(10);
            uVar33 = uVar32;
          }
        }
        uVar40 = uVar40 + 1;
        uVar32 = (ulong)uVar40;
        puVar36 = puVar36 + 1;
      } while (uVar40 != 4);
      uVar31 = uVar31 + 1;
    } while (uVar31 != 4);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  function_tests = function_tests + 1;
  iVar2 = iVar2 + local_38;
  iVar3 = local_40 + local_4c;
  local_38 = 0;
  uVar31 = 0;
  do {
    puVar42 = &DAT_0016343c;
    uVar44 = 0;
    do {
      iVar4 = (int)uVar33;
      iVar39 = xmlMemBlocks();
      pxVar30 = gen_xmlParserInputBufferPtr(uVar31,iVar4);
      uVar33 = (ulong)*puVar42;
      xmlParserInputBufferGrow(pxVar30);
      call_tests = call_tests + 1;
      xmlFreeParserInputBuffer(pxVar30);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar39 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferGrow",(ulong)(uint)(iVar4 - iVar39));
        local_38 = local_38 + 1;
        printf(" %d",(ulong)uVar31);
        uVar33 = (ulong)uVar44;
        printf(" %d");
        putchar(10);
      }
      uVar44 = uVar44 + 1;
      puVar42 = puVar42 + 1;
    } while (uVar44 != 4);
    uVar31 = uVar31 + 1;
  } while (uVar31 != 8);
  function_tests = function_tests + 1;
  local_4c = 0;
  uVar31 = 0;
  do {
    uVar44 = 0;
    do {
      uVar32 = 0;
      puVar37 = &DAT_00165d58;
      do {
        iVar39 = xmlMemBlocks();
        pxVar30 = gen_xmlParserInputBufferPtr(uVar31,(int)uVar33);
        uVar40 = 0xffffffff;
        if (uVar44 < 4) {
          uVar40 = (&DAT_0016343c)[uVar44];
        }
        uVar41 = (uint)uVar32;
        if (uVar41 < 3) {
          pcVar43 = (char *)*puVar37;
          sVar29 = strlen(pcVar43);
          if ((int)uVar40 <= (int)sVar29 + 1) goto LAB_0013dcde;
        }
        else {
          pcVar43 = (char *)0x0;
LAB_0013dcde:
          uVar33 = (ulong)uVar40;
          xmlParserInputBufferPush(pxVar30,uVar33,pcVar43);
          call_tests = call_tests + 1;
          xmlFreeParserInputBuffer(pxVar30);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar39 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferPush",
                   (ulong)(uint)(iVar4 - iVar39));
            local_4c = local_4c + 1;
            printf(" %d",(ulong)uVar31);
            printf(" %d",(ulong)uVar44);
            printf(" %d");
            putchar(10);
            uVar33 = uVar32;
          }
        }
        uVar41 = uVar41 + 1;
        uVar32 = (ulong)uVar41;
        puVar37 = puVar37 + 1;
      } while (uVar41 != 4);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    uVar31 = uVar31 + 1;
    if (uVar31 == 8) {
      function_tests = function_tests + 1;
      iVar39 = 0;
      uVar31 = 0;
      do {
        puVar42 = &DAT_0016343c;
        uVar44 = 0;
        do {
          iVar5 = (int)uVar33;
          iVar4 = xmlMemBlocks();
          pxVar30 = gen_xmlParserInputBufferPtr(uVar31,iVar5);
          uVar33 = (ulong)*puVar42;
          xmlParserInputBufferRead(pxVar30);
          call_tests = call_tests + 1;
          xmlFreeParserInputBuffer(pxVar30);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferRead",
                   (ulong)(uint)(iVar5 - iVar4));
            iVar39 = iVar39 + 1;
            printf(" %d",(ulong)uVar31);
            uVar33 = (ulong)uVar44;
            printf(" %d");
            putchar(10);
          }
          uVar44 = uVar44 + 1;
          puVar42 = puVar42 + 1;
        } while (uVar44 != 4);
        uVar31 = uVar31 + 1;
      } while (uVar31 != 8);
      function_tests = function_tests + 1;
      iVar4 = xmlMemBlocks();
      xmlPopInputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlPopInputCallbacks",(ulong)(uint)(iVar6 - iVar4));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar6 = xmlMemBlocks();
      xmlRegisterDefaultInputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterDefaultInputCallbacks",
               (ulong)(uint)(iVar8 - iVar6));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar8 = xmlMemBlocks();
      xmlRegisterDefaultOutputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar35 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterDefaultOutputCallbacks",
               (ulong)(uint)(iVar35 - iVar8));
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar35 = xmlMemBlocks();
      xmlRegisterHTTPPostCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar35 != iVar10) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRegisterHTTPPostCallbacks",
               (ulong)(uint)(iVar11 - iVar35));
        putchar(10);
      }
      function_tests = function_tests + 1;
      uVar31 = iVar3 + iVar2 + local_38 + local_4c + iVar39 + (uint)(iVar4 != iVar5) +
               (uint)(iVar6 != iVar7) + (uint)(iVar8 != iVar9) + (uint)(iVar35 != iVar10);
      if (uVar31 != 0) {
        printf("Module xmlIO: %d errors\n",(ulong)uVar31);
      }
      return uVar31;
    }
  } while( true );
}

Assistant:

static int
test_xmlIO(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlIO : 40 of 50 functions ...\n");
    test_ret += test_xmlAllocOutputBuffer();
    test_ret += test_xmlAllocParserInputBuffer();
    test_ret += test_xmlCheckFilename();
    test_ret += test_xmlCheckHTTPInput();
    test_ret += test_xmlCleanupInputCallbacks();
    test_ret += test_xmlCleanupOutputCallbacks();
    test_ret += test_xmlFileClose();
    test_ret += test_xmlFileMatch();
    test_ret += test_xmlFileOpen();
    test_ret += test_xmlFileRead();
    test_ret += test_xmlIOFTPClose();
    test_ret += test_xmlIOFTPMatch();
    test_ret += test_xmlIOFTPOpen();
    test_ret += test_xmlIOFTPRead();
    test_ret += test_xmlIOHTTPClose();
    test_ret += test_xmlIOHTTPMatch();
    test_ret += test_xmlIOHTTPOpen();
    test_ret += test_xmlIOHTTPRead();
    test_ret += test_xmlNoNetExternalEntityLoader();
    test_ret += test_xmlNormalizeWindowsPath();
    test_ret += test_xmlOutputBufferCreateBuffer();
    test_ret += test_xmlOutputBufferCreateFd();
    test_ret += test_xmlOutputBufferCreateFile();
    test_ret += test_xmlOutputBufferCreateFilename();
    test_ret += test_xmlOutputBufferFlush();
    test_ret += test_xmlOutputBufferGetContent();
    test_ret += test_xmlOutputBufferGetSize();
    test_ret += test_xmlOutputBufferWrite();
    test_ret += test_xmlOutputBufferWriteEscape();
    test_ret += test_xmlOutputBufferWriteString();
    test_ret += test_xmlParserGetDirectory();
    test_ret += test_xmlParserInputBufferCreateFd();
    test_ret += test_xmlParserInputBufferCreateFile();
    test_ret += test_xmlParserInputBufferCreateFilename();
    test_ret += test_xmlParserInputBufferCreateMem();
    test_ret += test_xmlParserInputBufferCreateStatic();
    test_ret += test_xmlParserInputBufferGrow();
    test_ret += test_xmlParserInputBufferPush();
    test_ret += test_xmlParserInputBufferRead();
    test_ret += test_xmlPopInputCallbacks();
    test_ret += test_xmlRegisterDefaultInputCallbacks();
    test_ret += test_xmlRegisterDefaultOutputCallbacks();
    test_ret += test_xmlRegisterHTTPPostCallbacks();

    if (test_ret != 0)
	printf("Module xmlIO: %d errors\n", test_ret);
    return(test_ret);
}